

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall xmrig::Client::handshake(Client *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])();
  if ((char)iVar1 != '\0') {
    lVar2 = std::chrono::_V2::steady_clock::now();
    this->m_expire = lVar2 / 1000000 + 20000;
    Tls::handshake(this->m_tls);
    return;
  }
  login(this);
  return;
}

Assistant:

void xmrig::Client::handshake()
{
#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_expire = Chrono::steadyMSecs() + kResponseTimeout;

        m_tls->handshake();
    }
    else
#   endif
    {
        login();
    }
}